

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O3

qreal easeOutInSine(qreal t)

{
  double dVar1;
  qreal qVar2;
  
  if (0.5 <= t) {
    dVar1 = t + t + -1.0;
    qVar2 = 1.0;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      dVar1 = cos(dVar1 * 1.5707963267948966);
      qVar2 = (1.0 - dVar1) * 0.5 + 0.5;
    }
  }
  else {
    dVar1 = sin((t + t) * 1.5707963267948966);
    qVar2 = dVar1 * 0.5;
  }
  return qVar2;
}

Assistant:

static qreal easeOutInSine(qreal t)
{
    if (t < 0.5) return easeOutSine (2*t)/2;
    return easeInSine(2*t - 1)/2 + 0.5;
}